

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O3

void graph_displace(t_gobj *z,_glist *glist,int dx,int dy)

{
  short *psVar1;
  int iVar2;
  
  if (((ulong)z[0xe].g_next & 0x100) == 0) {
    text_displace(z,glist,dx,dy);
    return;
  }
  *(short *)&z[2].g_next = *(short *)&z[2].g_next + (short)dx;
  psVar1 = (short *)((long)&z[2].g_next + 2);
  *psVar1 = *psVar1 + (short)dy;
  iVar2 = glist_isvisible(glist);
  if (iVar2 != 0) {
    glist_redraw((_glist *)z);
    canvas_fixlinesfor(glist,(t_text *)z);
    return;
  }
  return;
}

Assistant:

static void graph_displace(t_gobj *z, t_glist *glist, int dx, int dy)
{
    t_glist *x = (t_glist *)z;
    if (!x->gl_isgraph)
        text_widgetbehavior.w_displacefn(z, glist, dx, dy);
    else
    {
        x->gl_obj.te_xpix += dx;
        x->gl_obj.te_ypix += dy;
        if (glist_isvisible(glist)) {
            glist_redraw(x);
            canvas_fixlinesfor(glist, &x->gl_obj);
        }
    }
}